

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O1

void __thiscall QWidgetTextControlPrivate::_q_documentLayoutChanged(QWidgetTextControlPrivate *this)

{
  void **ppvVar1;
  void **ppvVar2;
  void **ppvVar3;
  undefined4 *puVar4;
  long in_FS_OFFSET;
  QObject local_70 [8];
  QObject local_68 [8];
  Connection local_60;
  code *local_58;
  ImplFn local_50;
  code *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ppvVar1 = *(void ***)&this->field_0x8;
  ppvVar3 = (void **)QTextDocument::documentLayout();
  local_58 = QWidgetTextControl::updateRequest;
  local_50 = (ImplFn)0x0;
  local_48 = QAbstractTextDocumentLayout::update;
  local_40 = 0;
  puVar4 = (undefined4 *)operator_new(0x20);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QtPrivate::
       QCallableObject<void_(QWidgetTextControl::*)(const_QRectF_&),_QtPrivate::List<const_QRectF_&>,_void>
       ::impl;
  *(code **)(puVar4 + 4) = QWidgetTextControl::updateRequest;
  *(undefined8 *)(puVar4 + 6) = 0;
  QObject::connectImpl
            ((QObject *)&local_60,ppvVar3,(QObject *)&local_48,ppvVar1,(QSlotObjectBase *)&local_58,
             (ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection(&local_60);
  local_48 = QAbstractTextDocumentLayout::updateBlock;
  local_40 = 0;
  local_58 = _q_updateBlock;
  local_50 = (ImplFn)0x0;
  ppvVar2 = *(void ***)&this->field_0x8;
  puVar4 = (undefined4 *)operator_new(0x20);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QWidgetTextControlPrivate::*)(const_QTextBlock_&),_QtPrivate::List<const_QTextBlock_&>,_void>
       ::impl;
  *(code **)(puVar4 + 4) = _q_updateBlock;
  *(undefined8 *)(puVar4 + 6) = 0;
  QObject::connectImpl
            (local_68,ppvVar3,(QObject *)&local_48,ppvVar2,(QSlotObjectBase *)&local_58,
             (ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_68);
  local_58 = QWidgetTextControl::documentSizeChanged;
  local_50 = (ImplFn)0x0;
  local_48 = QAbstractTextDocumentLayout::documentSizeChanged;
  local_40 = 0;
  puVar4 = (undefined4 *)operator_new(0x20);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QtPrivate::
       QCallableObject<void_(QWidgetTextControl::*)(const_QSizeF_&),_QtPrivate::List<const_QSizeF_&>,_void>
       ::impl;
  *(code **)(puVar4 + 4) = QWidgetTextControl::documentSizeChanged;
  *(undefined8 *)(puVar4 + 6) = 0;
  QObject::connectImpl
            (local_70,ppvVar3,(QObject *)&local_48,ppvVar1,(QSlotObjectBase *)&local_58,
             (ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_70);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControlPrivate::_q_documentLayoutChanged()
{
    Q_Q(QWidgetTextControl);
    QAbstractTextDocumentLayout *layout = doc->documentLayout();
    QObject::connect(layout, &QAbstractTextDocumentLayout::update, q,
                     &QWidgetTextControl::updateRequest);
    QObjectPrivate::connect(layout, &QAbstractTextDocumentLayout::updateBlock, this,
                            &QWidgetTextControlPrivate::_q_updateBlock);
    QObject::connect(layout, &QAbstractTextDocumentLayout::documentSizeChanged, q,
                     &QWidgetTextControl::documentSizeChanged);
}